

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::garbageCollect(Solver *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 local_30 [8];
  ClauseAllocator to;
  Solver *this_local;
  
  to._24_8_ = this;
  uVar1 = ClauseAllocator::size(&this->ca);
  uVar2 = ClauseAllocator::wasted(&this->ca);
  ClauseAllocator::ClauseAllocator((ClauseAllocator *)local_30,uVar1 - uVar2);
  relocAll(this,(ClauseAllocator *)local_30);
  if (1 < this->verbosity) {
    uVar1 = ClauseAllocator::size(&this->ca);
    uVar2 = ClauseAllocator::size((ClauseAllocator *)local_30);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",(ulong)(uVar1 << 2),
           (ulong)(uVar2 << 2));
  }
  ClauseAllocator::moveTo((ClauseAllocator *)local_30,&this->ca);
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)local_30);
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}